

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O1

int onmt::unicode::get_script_code(char *script_name)

{
  undefined8 *puVar1;
  int iVar2;
  int unaff_EBP;
  undefined8 *puVar3;
  undefined8 *puVar4;
  bool bVar5;
  
  puVar1 = DAT_003886d8;
  puVar3 = compat_scripts;
  bVar5 = compat_scripts == DAT_003886d8;
  if (!bVar5) {
    iVar2 = strcmp(script_name,(char *)*compat_scripts);
    unaff_EBP = *(int *)(puVar3 + 1);
    if (iVar2 != 0) {
      do {
        puVar4 = puVar3;
        puVar3 = puVar4 + 3;
        bVar5 = puVar3 == puVar1;
        if (bVar5) goto LAB_001ba1d4;
        iVar2 = strcmp(script_name,(char *)*puVar3);
      } while (iVar2 != 0);
      unaff_EBP = *(int *)(puVar4 + 4);
    }
  }
LAB_001ba1d4:
  if (bVar5) {
    iVar2 = u_getPropertyValueEnum_70(0x100a,script_name);
    return iVar2;
  }
  return unaff_EBP;
}

Assistant:

int get_script_code(const char* script_name)
    {
      for (const auto& pair : compat_scripts)
      {
        const auto& script_info = pair.first;
        if (strcmp(script_name, script_info.first) == 0)
          return script_info.second;
      }

      return u_getPropertyValueEnum(UCHAR_SCRIPT, script_name);
    }